

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O1

string * Corrade::Utility::
         ConfigurationValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::fromString(string *__return_storage_ptr__,string *value,ConfigurationValueFlags param_2)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ConfigurationValue<std::string>::fromString(const std::string& value, ConfigurationValueFlags) {
    return value;
}